

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

void keccak_digest(ssh_hash *hash,uchar *output)

{
  ssh_hashalg *psVar1;
  ssh_hashalg *psVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  ulong __n_00;
  keccak_state *s;
  undefined8 local_100;
  uchar padding [200];
  
  s = (keccak_state *)(hash + -0x1b);
  psVar2 = (ssh_hashalg *)0x0;
  psVar1 = (ssh_hashalg *)hash[-2].binarysink_;
  if (hash[-1].vt == (ssh_hashalg *)hash[-2].binarysink_) {
    psVar1 = psVar2;
  }
  __n = (long)hash[-1].vt - (long)psVar1;
  memset(padding,0,__n);
  padding[0] = padding[0] | *(byte *)&hash[-2].vt;
  padding[__n - 1] = padding[__n - 1] | 0x80;
  keccak_accumulate(s,padding,__n);
  lVar4 = 0;
  while (psVar2 != (ssh_hashalg *)0x5) {
    lVar3 = -200;
    local_100 = psVar2;
    for (; (lVar3 != 0 && (__n_00 = (long)hash[-1].binarysink_ - lVar4, __n_00 != 0));
        lVar4 = lVar4 + __n_00) {
      if (7 < __n_00) {
        __n_00 = 8;
      }
      padding._0_8_ = *(undefined8 *)(s->bytes + lVar3);
      memcpy(output + lVar4,padding,__n_00);
      lVar3 = lVar3 + 0x28;
    }
    s = (keccak_state *)(s->A[0] + 1);
    psVar2 = (ssh_hashalg *)((long)&local_100->new + 1);
  }
  return;
}

Assistant:

static void keccak_digest(ssh_hash *hash, unsigned char *output)
{
    struct keccak_hash *kh = container_of(hash, struct keccak_hash, hash);
    keccak_output(&kh->state, output);
}